

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O2

int32_t __thiscall icu_63::CollationKey::hashCode(CollationKey *this)

{
  int32_t iVar1;
  StackBufferOrFields *key;
  
  if (this->fHashCode != 0) {
    return this->fHashCode;
  }
  if (this->fFlagAndLength < 0) {
    key = (StackBufferOrFields *)(this->fUnion).fFields.fBytes;
  }
  else {
    key = &this->fUnion;
  }
  iVar1 = computeHashCode(key->fStackBuffer,this->fFlagAndLength & 0x7fffffff);
  this->fHashCode = iVar1;
  return iVar1;
}

Assistant:

int32_t
CollationKey::hashCode() const
{
    // (Cribbed from UnicodeString)
    // We cache the hashCode; when it becomes invalid, due to any change to the
    // string, we note this by setting it to kInvalidHashCode. [LIU]

    // Note: This method is semantically const, but physically non-const.

    if (fHashCode == kInvalidHashCode)
    {
        fHashCode = computeHashCode(getBytes(), getLength());
    }

    return fHashCode;
}